

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderPrimitiveQueries.cpp
# Opt level: O1

void __thiscall glcts::GeometryShaderPrimitiveQueries::deinit(GeometryShaderPrimitiveQueries *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar2 + 0x1680))(0);
  (**(code **)(lVar2 + 0x40))(0x8892,0);
  (**(code **)(lVar2 + 0xd8))(0);
  if (this->m_po_id != 0) {
    (**(code **)(lVar2 + 0x448))();
  }
  if (this->m_fs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
  }
  if (this->m_gs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
  }
  if (this->m_vs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
  }
  if (this->m_bo_small_id != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_bo_small_id);
  }
  if (this->m_bo_large_id != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_bo_large_id);
  }
  if (this->m_qo_primitives_generated_id != 0) {
    (**(code **)(lVar2 + 0x458))(1,&this->m_qo_primitives_generated_id);
  }
  if (this->m_qo_tf_primitives_written_id != 0) {
    (**(code **)(lVar2 + 0x458))(1,&this->m_qo_tf_primitives_written_id);
  }
  if (this->m_vao_id != 0) {
    (**(code **)(lVar2 + 0x490))(1,&this->m_vao_id);
  }
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void GeometryShaderPrimitiveQueries::deinit(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset OpenGL ES state */
	gl.useProgram(0);
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);
	gl.bindVertexArray(0);

	if (m_po_id != 0)
	{
		gl.deleteProgram(m_po_id);
	}

	if (m_fs_id != 0)
	{
		gl.deleteShader(m_fs_id);
	}

	if (m_gs_id != 0)
	{
		gl.deleteShader(m_gs_id);
	}

	if (m_vs_id != 0)
	{
		gl.deleteShader(m_vs_id);
	}

	if (m_bo_small_id != 0)
	{
		gl.deleteBuffers(1, &m_bo_small_id);
	}

	if (m_bo_large_id != 0)
	{
		gl.deleteBuffers(1, &m_bo_large_id);
	}

	if (m_qo_primitives_generated_id != 0)
	{
		gl.deleteQueries(1, &m_qo_primitives_generated_id);
	}

	if (m_qo_tf_primitives_written_id != 0)
	{
		gl.deleteQueries(1, &m_qo_tf_primitives_written_id);
	}

	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);
	}

	/* Release base class */
	TestCaseBase::deinit();
}